

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O2

void __thiscall
OpenMD::SquareMatrix3<double>::setupRotMat
          (SquareMatrix3<double> *this,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = sin(phi);
  dVar2 = sin(theta);
  dVar3 = sin(psi);
  dVar4 = cos(phi);
  dVar5 = cos(theta);
  dVar6 = cos(psi);
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       dVar6 * dVar4 + dVar3 * -dVar5 * dVar1;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1] =
       dVar6 * dVar1 + dVar3 * dVar5 * dVar4;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2] = dVar2 * dVar3
  ;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0] =
       dVar6 * -dVar5 * dVar1 - dVar4 * dVar3;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1] =
       dVar6 * dVar5 * dVar4 - dVar1 * dVar3;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2] = dVar2 * dVar6
  ;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0] = dVar2 * dVar1
  ;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1] =
       -dVar2 * dVar4;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2] = dVar5;
  return;
}

Assistant:

void setupRotMat(Real phi, Real theta, Real psi) {
      Real sphi, stheta, spsi;
      Real cphi, ctheta, cpsi;

      sphi   = sin(phi);
      stheta = sin(theta);
      spsi   = sin(psi);
      cphi   = cos(phi);
      ctheta = cos(theta);
      cpsi   = cos(psi);

      this->data_[0][0] = cpsi * cphi - ctheta * sphi * spsi;
      this->data_[0][1] = cpsi * sphi + ctheta * cphi * spsi;
      this->data_[0][2] = spsi * stheta;

      this->data_[1][0] = -spsi * cphi - ctheta * sphi * cpsi;
      this->data_[1][1] = -spsi * sphi + ctheta * cphi * cpsi;
      this->data_[1][2] = cpsi * stheta;

      this->data_[2][0] = stheta * sphi;
      this->data_[2][1] = -stheta * cphi;
      this->data_[2][2] = ctheta;
    }